

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__write_pixel(stbi__write_context *s,int rgb_dir,int comp,int write_alpha,int expand_mono,
                       uchar *d)

{
  int local_34;
  uchar auStack_2e [2];
  int k;
  uchar px [3];
  uchar *puStack_28;
  uchar bg [3];
  uchar *d_local;
  int expand_mono_local;
  int write_alpha_local;
  int comp_local;
  int rgb_dir_local;
  stbi__write_context *s_local;
  
  puStack_28 = d;
  k._1_2_ = 0xff;
  k._3_1_ = 0xff;
  if (write_alpha < 0) {
    stbiw__write1(s,d[comp + -1]);
  }
  if (comp - 1U < 2) {
    if (expand_mono == 0) {
      stbiw__write1(s,*puStack_28);
    }
    else {
      stbiw__write3(s,*puStack_28,*puStack_28,*puStack_28);
    }
    goto LAB_00107bbf;
  }
  if (comp != 3) {
    if (comp != 4) goto LAB_00107bbf;
    if (write_alpha == 0) {
      for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
        auStack_2e[local_34] =
             *(char *)((long)&k + (long)local_34 + 1) +
             (char)((int)(((uint)puStack_28[local_34] -
                          (uint)*(byte *)((long)&k + (long)local_34 + 1)) * (uint)puStack_28[3]) /
                   0xff);
      }
      stbiw__write3(s,auStack_2e[1 - rgb_dir],auStack_2e[1],auStack_2e[rgb_dir + 1]);
      goto LAB_00107bbf;
    }
  }
  stbiw__write3(s,puStack_28[1 - rgb_dir],puStack_28[1],puStack_28[rgb_dir + 1]);
LAB_00107bbf:
  if (0 < write_alpha) {
    stbiw__write1(s,puStack_28[comp + -1]);
  }
  return;
}

Assistant:

static void stbiw__write_pixel(stbi__write_context *s, int rgb_dir, int comp, int write_alpha, int expand_mono, unsigned char *d)
{
   unsigned char bg[3] = { 255, 0, 255}, px[3];
   int k;

   if (write_alpha < 0)
      stbiw__write1(s, d[comp - 1]);

   switch (comp) {
      case 2: // 2 pixels = mono + alpha, alpha is written separately, so same as 1-channel case
      case 1:
         if (expand_mono)
            stbiw__write3(s, d[0], d[0], d[0]); // monochrome bmp
         else
            stbiw__write1(s, d[0]);  // monochrome TGA
         break;
      case 4:
         if (!write_alpha) {
            // composite against pink background
            for (k = 0; k < 3; ++k)
               px[k] = bg[k] + ((d[k] - bg[k]) * d[3]) / 255;
            stbiw__write3(s, px[1 - rgb_dir], px[1], px[1 + rgb_dir]);
            break;
         }
         /* FALLTHROUGH */
      case 3:
         stbiw__write3(s, d[1 - rgb_dir], d[1], d[1 + rgb_dir]);
         break;
   }
   if (write_alpha > 0)
      stbiw__write1(s, d[comp - 1]);
}